

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O2

void __thiscall
slang::TimeTrace::Profiler::begin
          (Profiler *this,string *name,
          function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          detail)

{
  long *in_FS_OFFSET;
  Entry local_78;
  
  stack::__tls_init();
  local_78.start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_78.duration.__r = 0;
  local_78.threadId._M_thread = pthread_self();
  std::__cxx11::string::string(&local_78.name,name);
  (*detail.callback)(&local_78.detail,detail.callable);
  std::vector<slang::Entry,_std::allocator<slang::Entry>_>::emplace_back<slang::Entry>
            ((vector<slang::Entry,_std::allocator<slang::Entry>_> *)(*in_FS_OFFSET + -0x38),
             &local_78);
  Entry::~Entry(&local_78);
  return;
}

Assistant:

void begin(std::string name, function_ref<std::string()> detail) {
        stack.push_back(
            Entry{steady_clock::now(), {}, std::this_thread::get_id(), std::move(name), detail()});
    }